

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap,
          size_t c,size_t i,size_t *head,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *emitted,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visited)

{
  size_t *psVar1;
  bool bVar2;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  const_reference pvVar3;
  cmListFileBacktrace *__args_3;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *pvVar4;
  reference pvVar5;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar6;
  cmListFileBacktrace local_c8;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  size_t local_b0;
  size_t j;
  cmGraphEdge *edge;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  EdgeList *el;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *emitted_local;
  size_t *head_local;
  size_t i_local;
  size_t c_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap_local;
  cmComputeTargetDepends *this_local;
  
  head_local = (size_t *)i;
  i_local = c;
  c_local = (size_t)cmap;
  cmap_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (visited,(value_type_conflict4 *)&head_local);
  if (((pVar6.second ^ 0xffU) & 1) == 0) {
    pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert(emitted,(value_type_conflict4 *)&head_local);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->InitialGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (size_type)head_local)->
                 super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
      edge = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                         *)&edge), psVar1 = head_local, bVar2) {
        j = (size_t)__gnu_cxx::
                    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                    ::operator*(&__end2);
        local_b0 = cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)j);
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)c_local,
                            local_b0);
        if ((*pvVar3 == i_local) && (bVar2 = cmGraphEdge::IsStrong((cmGraphEdge *)j), bVar2)) {
          pvVar4 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                   std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                             (&(this->FinalGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                              (size_type)head_local);
          local_b1 = true;
          local_b2 = cmGraphEdge::IsCross((cmGraphEdge *)j);
          __args_3 = cmGraphEdge::GetBacktrace((cmGraphEdge *)j);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                    (pvVar4,&local_b0,&local_b1,&local_b2,__args_3);
          bVar2 = IntraComponent(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      c_local,i_local,local_b0,head,emitted,visited);
          if (!bVar2) {
            return false;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
        ::operator++(&__end2);
      }
      if (*head == 0xffffffffffffffff) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->ComponentTail,i_local);
        *pvVar5 = (value_type)psVar1;
      }
      else {
        pvVar4 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                 std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                           (&(this->FinalGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                            (size_type)head_local);
        local_b3 = false;
        local_b4 = false;
        local_c8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_c8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_c8);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
                  (pvVar4,head,&local_b3,&local_b4,&local_c8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
      }
      *head = (size_t)head_local;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<size_t> const& cmap,
                                            size_t c, size_t i, size_t* head,
                                            std::set<size_t>& emitted,
                                            std::set<size_t>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (cmGraphEdge const& edge : el) {
      size_t j = edge;
      if (cmap[j] == c && edge.IsStrong()) {
        this->FinalGraph[i].emplace_back(j, true, edge.IsCross(),
                                         edge.GetBacktrace());
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head != cmComputeComponentGraph::INVALID_COMPONENT) {
      this->FinalGraph[i].emplace_back(*head, false, false,
                                       cmListFileBacktrace());
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}